

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall
soplex::SoPlexBase<double>::printSolutionStatistics(SoPlexBase<double> *this,ostream *os)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  double dVar6;
  Rational maxviol;
  Rational sumviol;
  string local_e8;
  string local_c8;
  data_type local_a8;
  undefined4 local_98;
  undefined2 local_94;
  char local_92;
  ulong local_88;
  void *local_80;
  undefined4 local_78;
  undefined2 local_74;
  char local_72;
  data_type local_68;
  undefined4 local_58;
  undefined2 local_54;
  char local_52;
  ulong local_48;
  void *local_40;
  undefined4 local_38;
  undefined2 local_34;
  char local_32;
  
  lVar4 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar4 + -0x18) + 8) = 8;
  lVar4 = *(long *)(lVar4 + -0x18);
  *(uint *)(os + lVar4 + 0x18) = *(uint *)(os + lVar4 + 0x18) & 0xfffffefb | 0x100;
  if (this->_lastSolveMode == 2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Solution (rational) : \n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Objective value   : ",0x16);
    objValueRational((Rational *)&local_a8.ld,this);
    poVar3 = boost::multiprecision::operator<<
                       (os,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)&local_a8.ld);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((local_74._1_1_ == '\0') && (local_72 == '\0')) {
      operator_delete(local_80,(local_88 & 0xffffffff) << 3);
    }
    if ((local_94._1_1_ == '\0') && (local_92 == '\0')) {
      operator_delete(local_a8.ld.data,(local_a8.la[0] & 0xffffffff) << 3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"Size (base 2/10)    : \n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Total primal      : ",0x16);
    iVar2 = totalSizePrimalRational(this,2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
    iVar2 = totalSizePrimalRational(this,10);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  Total dual        : ",0x16);
    iVar2 = totalSizeDualRational(this,2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
    iVar2 = totalSizeDualRational(this,10);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  DLCM primal       : ",0x16);
    iVar2 = dlcmSizePrimalRational(this,2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
    iVar2 = dlcmSizePrimalRational(this,10);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  DLCM dual         : ",0x16);
    iVar2 = dlcmSizeDualRational(this,2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
    iVar2 = dlcmSizeDualRational(this,10);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  DMAX primal       : ",0x16);
    iVar2 = dmaxSizePrimalRational(this,2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
    iVar2 = dmaxSizePrimalRational(this,10);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  DMAX dual         : ",0x16);
    iVar2 = dmaxSizeDualRational(this,2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
    iVar2 = dmaxSizeDualRational(this,10);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    lVar4 = 1;
    pcVar5 = "\n";
  }
  else if (this->_lastSolveMode == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Solution (real)     : \n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Objective value   : ",0x16);
    dVar6 = objValueReal(this);
    poVar3 = std::ostream::_M_insert<double>(dVar6);
    pcVar5 = "\n";
    lVar4 = 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Solution            : \n",0x17);
    pcVar5 = "  Objective value   : -\n";
    lVar4 = 0x18;
    poVar3 = os;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  iVar2 = this->_currentSettings->_intParamValues[0x12];
  if ((iVar2 == 2) || ((iVar2 == 1 && (this->_currentSettings->_intParamValues[0x10] == 1)))) {
    local_a8.la[0] = 0;
    local_98 = 1;
    local_94 = 0x100;
    local_92 = '\0';
    local_88 = 1;
    local_78 = 1;
    local_74 = 0x100;
    local_72 = '\0';
    local_68.la[0] = 0;
    local_58 = 1;
    local_54 = 0x100;
    local_52 = '\0';
    local_48 = 1;
    local_38 = 1;
    local_34 = 0x100;
    local_32 = '\0';
    std::__ostream_insert<char,std::char_traits<char>>(os,"Violation (rational): \n",0x17);
    bVar1 = getBoundViolationRational(this,(Rational *)&local_a8.ld,(Rational *)&local_68.ld);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Max/sum bound     : ",0x16);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&local_c8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&local_a8.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&local_e8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&local_68.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_e8._M_dataplus._M_p,local_e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Max/sum bound     : - / -\n",0x1c);
    }
    bVar1 = getRowViolationRational(this,(Rational *)&local_a8.ld,(Rational *)&local_68.ld);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Max/sum row       : ",0x16);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&local_c8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&local_a8.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&local_e8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&local_68.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_e8._M_dataplus._M_p,local_e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Max/sum row       : - / -\n",0x1c);
    }
    bVar1 = getRedCostViolationRational(this,(Rational *)&local_a8.ld,(Rational *)&local_68.ld);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Max/sum redcost   : ",0x16);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&local_c8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&local_a8.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&local_e8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&local_68.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_e8._M_dataplus._M_p,local_e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Max/sum redcost   : - / -\n",0x1c);
    }
    bVar1 = getDualViolationRational(this,(Rational *)&local_a8.ld,(Rational *)&local_68.ld);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Max/sum dual      : ",0x16);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&local_c8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&local_a8.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&local_e8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&local_68.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_e8._M_dataplus._M_p,local_e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Max/sum dual      : - / -\n",0x1c);
    }
    if ((local_34._1_1_ == '\0') && (local_32 == '\0')) {
      operator_delete(local_40,(local_48 & 0xffffffff) << 3);
    }
    if ((local_54._1_1_ == '\0') && (local_52 == '\0')) {
      operator_delete(local_68.ld.data,(local_68.la[0] & 0xffffffff) << 3);
    }
    if ((local_74._1_1_ == '\0') && (local_72 == '\0')) {
      operator_delete(local_80,(local_88 & 0xffffffff) << 3);
    }
    if ((local_94._1_1_ == '\0') && (local_92 == '\0')) {
      operator_delete(local_a8.ld.data,(local_a8.la[0] & 0xffffffff) << 3);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Violations (real)   : \n",0x17);
    bVar1 = getBoundViolation(this,(double *)local_a8.la,(double *)local_68.la);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Max/sum bound     : ",0x16);
      poVar3 = std::ostream::_M_insert<double>((double)local_a8.la[0]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
      poVar3 = std::ostream::_M_insert<double>((double)local_68.la[0]);
      pcVar5 = "\n";
      lVar4 = 1;
    }
    else {
      pcVar5 = "  Max/sum bound     : - / -\n";
      lVar4 = 0x1c;
      poVar3 = os;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
    bVar1 = getRowViolation(this,(double *)local_a8.la,(double *)local_68.la);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Max/sum row       : ",0x16);
      poVar3 = std::ostream::_M_insert<double>((double)local_a8.la[0]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
      poVar3 = std::ostream::_M_insert<double>((double)local_68.la[0]);
      pcVar5 = "\n";
      lVar4 = 1;
    }
    else {
      pcVar5 = "  Max/sum row       : - / -\n";
      lVar4 = 0x1c;
      poVar3 = os;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
    bVar1 = getRedCostViolation(this,(double *)local_a8.la,(double *)local_68.la);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Max/sum redcost   : ",0x16);
      poVar3 = std::ostream::_M_insert<double>((double)local_a8.la[0]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
      poVar3 = std::ostream::_M_insert<double>((double)local_68.la[0]);
      pcVar5 = "\n";
      lVar4 = 1;
    }
    else {
      pcVar5 = "  Max/sum redcost   : - / -\n";
      lVar4 = 0x1c;
      poVar3 = os;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
    bVar1 = getDualViolation(this,(double *)local_a8.la,(double *)local_68.la);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  Max/sum dual      : ",0x16);
      poVar3 = std::ostream::_M_insert<double>((double)local_a8.la[0]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
      os = std::ostream::_M_insert<double>((double)local_68.la[0]);
      pcVar5 = "\n";
      lVar4 = 1;
    }
    else {
      pcVar5 = "  Max/sum dual      : - / -\n";
      lVar4 = 0x1c;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,lVar4);
  }
  return;
}

Assistant:

void SoPlexBase<R>::printSolutionStatistics(std::ostream& os)
{
   SPxOut::setScientific(os);

   if(_lastSolveMode == SOLVEMODE_REAL)
   {
      os << "Solution (real)     : \n"
         << "  Objective value   : " << objValueReal() << "\n";
   }
   else if(_lastSolveMode == SOLVEMODE_RATIONAL)
   {
      os << "Solution (rational) : \n"
         << "  Objective value   : " << objValueRational() << "\n";
      os << "Size (base 2/10)    : \n"
         << "  Total primal      : " << totalSizePrimalRational() << " / " << totalSizePrimalRational(
            10) << "\n"
         << "  Total dual        : " << totalSizeDualRational() << " / " << totalSizeDualRational(10) << "\n"
         << "  DLCM primal       : " << dlcmSizePrimalRational() << " / " << dlcmSizePrimalRational(
            10) << "\n"
         << "  DLCM dual         : " << dlcmSizeDualRational() << " / " << dlcmSizeDualRational(10) << "\n"
         << "  DMAX primal       : " << dmaxSizePrimalRational() << " / " << dmaxSizePrimalRational(
            10) << "\n"
         << "  DMAX dual         : " << dmaxSizeDualRational() << " / " << dmaxSizeDualRational(10) << "\n";
   }
   else
   {
      os << "Solution            : \n"
         << "  Objective value   : -\n";
   }

   if(intParam(CHECKMODE) == CHECKMODE_RATIONAL
         || (intParam(CHECKMODE) == CHECKMODE_AUTO && intParam(READMODE) == READMODE_RATIONAL))
   {
      Rational maxviol;
      Rational sumviol;

      os << "Violation (rational): \n";

      if(getBoundViolationRational(maxviol, sumviol))
         os << "  Max/sum bound     : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum bound     : - / -\n";

      if(getRowViolationRational(maxviol, sumviol))
         os << "  Max/sum row       : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum row       : - / -\n";

      if(getRedCostViolationRational(maxviol, sumviol))
         os << "  Max/sum redcost   : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum redcost   : - / -\n";

      if(getDualViolationRational(maxviol, sumviol))
         os << "  Max/sum dual      : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum dual      : - / -\n";
   }
   else
   {
      R maxviol;
      R sumviol;

      os << "Violations (real)   : \n";

      if(getBoundViolation(maxviol, sumviol))
         os << "  Max/sum bound     : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum bound     : - / -\n";

      if(getRowViolation(maxviol, sumviol))
         os << "  Max/sum row       : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum row       : - / -\n";

      if(getRedCostViolation(maxviol, sumviol))
         os << "  Max/sum redcost   : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum redcost   : - / -\n";

      if(getDualViolation(maxviol, sumviol))
         os << "  Max/sum dual      : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum dual      : - / -\n";
   }
}